

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# av1_inv_txfm_avx2.c
# Opt level: O2

void idct64_stage5_high48_avx2(__m256i *x,int32_t *cospi,__m256i _r,int8_t cos_bit)

{
  __m256i alVar1;
  __m256i alVar2;
  __m256i alVar3;
  __m256i w0;
  __m256i w1;
  __m256i w1_00;
  __m256i w1_01;
  __m256i w1_02;
  __m256i _r_00;
  __m256i _r_01;
  __m256i _r_02;
  __m256i _r_03;
  int32_t cos_bit_00;
  int32_t cos_bit_01;
  int32_t cos_bit_02;
  undefined4 uVar4;
  undefined4 uVar5;
  undefined8 in_XMM0_Qa;
  undefined8 in_XMM0_Qb;
  undefined8 in_YMM0_H;
  longlong in_register_00001218;
  undefined4 uVar6;
  undefined4 uVar7;
  undefined4 uVar8;
  undefined4 uVar9;
  undefined4 uVar10;
  undefined4 uVar11;
  undefined4 uVar12;
  undefined4 uVar13;
  undefined4 uVar14;
  undefined4 uVar15;
  undefined4 uVar16;
  undefined4 uVar17;
  undefined4 uVar18;
  undefined4 uVar19;
  
  uVar5 = 0x31ff04f;
  uVar4 = 0xd4ef71c;
  alVar1[1] = in_XMM0_Qb;
  alVar1[0] = in_XMM0_Qa;
  alVar1[2] = in_YMM0_H;
  alVar1[3] = in_register_00001218;
  w1[1]._0_4_ = 0xd4ef71c;
  w1[0] = 0xd4ef71c0d4ef71c;
  w1[1]._4_4_ = 0xd4ef71c;
  w1[2]._0_4_ = 0xd4ef71c;
  w1[2]._4_4_ = 0xd4ef71c;
  w1[3]._0_4_ = 0xd4ef71c;
  w1[3]._4_4_ = 0xd4ef71c;
  _r_00[1]._0_4_ = 0x31ff04f;
  _r_00[0] = 0x31ff04f031ff04f;
  _r_00[1]._4_4_ = 0x31ff04f;
  _r_00[2]._0_4_ = 0x31ff04f;
  _r_00[2]._4_4_ = 0x31ff04f;
  _r_00[3]._0_4_ = 0x31ff04f;
  _r_00[3]._4_4_ = 0x31ff04f;
  uVar6 = uVar4;
  uVar7 = uVar4;
  uVar8 = uVar4;
  uVar9 = uVar4;
  uVar10 = uVar4;
  uVar11 = uVar4;
  uVar12 = uVar4;
  uVar13 = uVar5;
  uVar14 = uVar5;
  uVar15 = uVar5;
  uVar16 = uVar5;
  uVar17 = uVar5;
  uVar18 = uVar5;
  uVar19 = uVar5;
  btf_16_w16_avx2(alVar1,w1,x + 0x11,x + 0x1e,_r_00,0x8e40000);
  alVar2[1] = in_XMM0_Qb;
  alVar2[0] = in_XMM0_Qa;
  alVar2[2] = in_YMM0_H;
  alVar2[3] = in_register_00001218;
  w1_00[0]._4_4_ = uVar6;
  w1_00[0]._0_4_ = uVar4;
  w1_00[1]._0_4_ = uVar7;
  w1_00[1]._4_4_ = uVar8;
  w1_00[2]._0_4_ = uVar9;
  w1_00[2]._4_4_ = uVar10;
  w1_00[3]._0_4_ = uVar11;
  w1_00[3]._4_4_ = uVar12;
  _r_01[0]._4_4_ = uVar13;
  _r_01[0]._0_4_ = uVar5;
  _r_01[1]._0_4_ = uVar14;
  _r_01[1]._4_4_ = uVar15;
  _r_01[2]._0_4_ = uVar16;
  _r_01[2]._4_4_ = uVar17;
  _r_01[3]._0_4_ = uVar18;
  _r_01[3]._4_4_ = uVar19;
  btf_16_w16_avx2(alVar2,w1_00,x + 0x12,x + 0x1d,_r_01,cos_bit_00);
  alVar3[1] = in_XMM0_Qb;
  alVar3[0] = in_XMM0_Qa;
  alVar3[2] = in_YMM0_H;
  alVar3[3] = in_register_00001218;
  w1_01[0]._4_4_ = uVar6;
  w1_01[0]._0_4_ = uVar4;
  w1_01[1]._0_4_ = uVar7;
  w1_01[1]._4_4_ = uVar8;
  w1_01[2]._0_4_ = uVar9;
  w1_01[2]._4_4_ = uVar10;
  w1_01[3]._0_4_ = uVar11;
  w1_01[3]._4_4_ = uVar12;
  _r_02[0]._4_4_ = uVar13;
  _r_02[0]._0_4_ = uVar5;
  _r_02[1]._0_4_ = uVar14;
  _r_02[1]._4_4_ = uVar15;
  _r_02[2]._0_4_ = uVar16;
  _r_02[2]._4_4_ = uVar17;
  _r_02[3]._0_4_ = uVar18;
  _r_02[3]._4_4_ = uVar19;
  btf_16_w16_avx2(alVar3,w1_01,x + 0x15,x + 0x1a,_r_02,cos_bit_01);
  w0[1] = in_XMM0_Qb;
  w0[0] = in_XMM0_Qa;
  w0[2] = in_YMM0_H;
  w0[3] = in_register_00001218;
  w1_02[0]._4_4_ = uVar6;
  w1_02[0]._0_4_ = uVar4;
  w1_02[1]._0_4_ = uVar7;
  w1_02[1]._4_4_ = uVar8;
  w1_02[2]._0_4_ = uVar9;
  w1_02[2]._4_4_ = uVar10;
  w1_02[3]._0_4_ = uVar11;
  w1_02[3]._4_4_ = uVar12;
  _r_03[0]._4_4_ = uVar13;
  _r_03[0]._0_4_ = uVar5;
  _r_03[1]._0_4_ = uVar14;
  _r_03[1]._4_4_ = uVar15;
  _r_03[2]._0_4_ = uVar16;
  _r_03[2]._4_4_ = uVar17;
  _r_03[3]._0_4_ = uVar18;
  _r_03[3]._4_4_ = uVar19;
  btf_16_w16_avx2(w0,w1_02,x + 0x16,x + 0x19,_r_03,cos_bit_02);
  alVar1 = x[0x20];
  alVar2 = x[0x21];
  alVar3 = (__m256i)vpaddsw_avx2((undefined1  [32])alVar1,(undefined1  [32])x[0x23]);
  x[0x20] = alVar3;
  alVar1 = (__m256i)vpsubsw_avx2((undefined1  [32])alVar1,(undefined1  [32])x[0x23]);
  x[0x23] = alVar1;
  alVar1 = (__m256i)vpaddsw_avx2((undefined1  [32])alVar2,(undefined1  [32])x[0x22]);
  x[0x21] = alVar1;
  alVar1 = (__m256i)vpsubsw_avx2((undefined1  [32])alVar2,(undefined1  [32])x[0x22]);
  x[0x22] = alVar1;
  alVar1 = x[0x27];
  alVar2 = (__m256i)vpaddsw_avx2((undefined1  [32])alVar1,(undefined1  [32])x[0x24]);
  x[0x27] = alVar2;
  alVar1 = (__m256i)vpsubsw_avx2((undefined1  [32])alVar1,(undefined1  [32])x[0x24]);
  x[0x24] = alVar1;
  alVar1 = x[0x26];
  alVar2 = (__m256i)vpaddsw_avx2((undefined1  [32])alVar1,(undefined1  [32])x[0x25]);
  x[0x26] = alVar2;
  alVar1 = (__m256i)vpsubsw_avx2((undefined1  [32])alVar1,(undefined1  [32])x[0x25]);
  x[0x25] = alVar1;
  alVar1 = x[0x28];
  alVar2 = (__m256i)vpaddsw_avx2((undefined1  [32])alVar1,(undefined1  [32])x[0x2b]);
  x[0x28] = alVar2;
  alVar1 = (__m256i)vpsubsw_avx2((undefined1  [32])alVar1,(undefined1  [32])x[0x2b]);
  x[0x2b] = alVar1;
  alVar1 = x[0x29];
  alVar2 = (__m256i)vpaddsw_avx2((undefined1  [32])alVar1,(undefined1  [32])x[0x2a]);
  x[0x29] = alVar2;
  alVar1 = (__m256i)vpsubsw_avx2((undefined1  [32])alVar1,(undefined1  [32])x[0x2a]);
  x[0x2a] = alVar1;
  alVar1 = x[0x2f];
  alVar2 = (__m256i)vpaddsw_avx2((undefined1  [32])alVar1,(undefined1  [32])x[0x2c]);
  x[0x2f] = alVar2;
  alVar1 = (__m256i)vpsubsw_avx2((undefined1  [32])alVar1,(undefined1  [32])x[0x2c]);
  x[0x2c] = alVar1;
  alVar1 = x[0x2e];
  alVar2 = (__m256i)vpaddsw_avx2((undefined1  [32])alVar1,(undefined1  [32])x[0x2d]);
  x[0x2e] = alVar2;
  alVar1 = (__m256i)vpsubsw_avx2((undefined1  [32])alVar1,(undefined1  [32])x[0x2d]);
  x[0x2d] = alVar1;
  alVar1 = x[0x30];
  alVar2 = (__m256i)vpaddsw_avx2((undefined1  [32])alVar1,(undefined1  [32])x[0x33]);
  x[0x30] = alVar2;
  alVar1 = (__m256i)vpsubsw_avx2((undefined1  [32])alVar1,(undefined1  [32])x[0x33]);
  x[0x33] = alVar1;
  alVar1 = x[0x31];
  alVar2 = (__m256i)vpaddsw_avx2((undefined1  [32])alVar1,(undefined1  [32])x[0x32]);
  x[0x31] = alVar2;
  alVar1 = (__m256i)vpsubsw_avx2((undefined1  [32])alVar1,(undefined1  [32])x[0x32]);
  x[0x32] = alVar1;
  alVar1 = x[0x37];
  alVar2 = (__m256i)vpaddsw_avx2((undefined1  [32])alVar1,(undefined1  [32])x[0x34]);
  x[0x37] = alVar2;
  alVar1 = (__m256i)vpsubsw_avx2((undefined1  [32])alVar1,(undefined1  [32])x[0x34]);
  x[0x34] = alVar1;
  alVar1 = x[0x36];
  alVar2 = (__m256i)vpaddsw_avx2((undefined1  [32])alVar1,(undefined1  [32])x[0x35]);
  x[0x36] = alVar2;
  alVar1 = (__m256i)vpsubsw_avx2((undefined1  [32])alVar1,(undefined1  [32])x[0x35]);
  x[0x35] = alVar1;
  alVar1 = x[0x38];
  alVar2 = (__m256i)vpaddsw_avx2((undefined1  [32])alVar1,(undefined1  [32])x[0x3b]);
  x[0x38] = alVar2;
  alVar1 = (__m256i)vpsubsw_avx2((undefined1  [32])alVar1,(undefined1  [32])x[0x3b]);
  x[0x3b] = alVar1;
  alVar1 = x[0x39];
  alVar2 = (__m256i)vpaddsw_avx2((undefined1  [32])alVar1,(undefined1  [32])x[0x3a]);
  x[0x39] = alVar2;
  alVar1 = (__m256i)vpsubsw_avx2((undefined1  [32])alVar1,(undefined1  [32])x[0x3a]);
  x[0x3a] = alVar1;
  alVar1 = x[0x3f];
  alVar2 = (__m256i)vpaddsw_avx2((undefined1  [32])alVar1,(undefined1  [32])x[0x3c]);
  x[0x3f] = alVar2;
  alVar1 = (__m256i)vpsubsw_avx2((undefined1  [32])alVar1,(undefined1  [32])x[0x3c]);
  x[0x3c] = alVar1;
  alVar1 = x[0x3e];
  alVar2 = (__m256i)vpaddsw_avx2((undefined1  [32])alVar1,(undefined1  [32])x[0x3d]);
  x[0x3e] = alVar2;
  alVar1 = (__m256i)vpsubsw_avx2((undefined1  [32])alVar1,(undefined1  [32])x[0x3d]);
  x[0x3d] = alVar1;
  return;
}

Assistant:

static inline void idct64_stage5_high48_avx2(__m256i *x, const int32_t *cospi,
                                             const __m256i _r, int8_t cos_bit) {
  (void)cos_bit;
  const __m256i cospi_m08_p56 = pair_set_w16_epi16(-cospi[8], cospi[56]);
  const __m256i cospi_p56_p08 = pair_set_w16_epi16(cospi[56], cospi[8]);
  const __m256i cospi_m56_m08 = pair_set_w16_epi16(-cospi[56], -cospi[8]);
  const __m256i cospi_m40_p24 = pair_set_w16_epi16(-cospi[40], cospi[24]);
  const __m256i cospi_p24_p40 = pair_set_w16_epi16(cospi[24], cospi[40]);
  const __m256i cospi_m24_m40 = pair_set_w16_epi16(-cospi[24], -cospi[40]);
  btf_16_w16_avx2(cospi_m08_p56, cospi_p56_p08, &x[17], &x[30], _r, cos_bit);
  btf_16_w16_avx2(cospi_m56_m08, cospi_m08_p56, &x[18], &x[29], _r, cos_bit);
  btf_16_w16_avx2(cospi_m40_p24, cospi_p24_p40, &x[21], &x[26], _r, cos_bit);
  btf_16_w16_avx2(cospi_m24_m40, cospi_m40_p24, &x[22], &x[25], _r, cos_bit);
  btf_16_adds_subs_avx2(&x[32], &x[35]);
  btf_16_adds_subs_avx2(&x[33], &x[34]);
  btf_16_adds_subs_avx2(&x[39], &x[36]);
  btf_16_adds_subs_avx2(&x[38], &x[37]);
  btf_16_adds_subs_avx2(&x[40], &x[43]);
  btf_16_adds_subs_avx2(&x[41], &x[42]);
  btf_16_adds_subs_avx2(&x[47], &x[44]);
  btf_16_adds_subs_avx2(&x[46], &x[45]);
  btf_16_adds_subs_avx2(&x[48], &x[51]);
  btf_16_adds_subs_avx2(&x[49], &x[50]);
  btf_16_adds_subs_avx2(&x[55], &x[52]);
  btf_16_adds_subs_avx2(&x[54], &x[53]);
  btf_16_adds_subs_avx2(&x[56], &x[59]);
  btf_16_adds_subs_avx2(&x[57], &x[58]);
  btf_16_adds_subs_avx2(&x[63], &x[60]);
  btf_16_adds_subs_avx2(&x[62], &x[61]);
}